

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O0

void __thiscall RedBlackTree::fixDelete(RedBlackTree *this,Node **node)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  Node *local_48;
  Node *local_38;
  Node *ptr;
  Node *parent;
  Node *sibling;
  Node *child;
  Node **node_local;
  RedBlackTree *this_local;
  
  if (*node != (Node *)0x0) {
    if (*node == this->root) {
      this->root = (Node *)0x0;
    }
    else {
      child = (Node *)node;
      node_local = &this->root;
      iVar3 = getColor(this,node);
      if (((iVar3 == 0) || (iVar3 = getColor(this,(Node **)(*(long *)child + 8)), iVar3 == 0)) ||
         (iVar3 = getColor(this,(Node **)(*(long *)child + 0x10)), iVar3 == 0)) {
        if (*(long *)(*(long *)child + 8) == 0) {
          local_48 = *(Node **)(*(long *)child + 0x10);
        }
        else {
          local_48 = *(Node **)(*(long *)child + 8);
        }
        sibling = local_48;
        lVar1._0_4_ = child->value;
        lVar1._4_4_ = child->color;
        if (lVar1 == *(long *)(*(long *)(*(long *)child + 0x18) + 8)) {
          *(Node **)(*(long *)(*(long *)child + 0x18) + 8) = local_48;
          if (local_48 != (Node *)0x0) {
            local_48->parent = *(Node **)(*(long *)child + 0x18);
          }
          setColor(this,&sibling,1);
          if (*(void **)child != (void *)0x0) {
            operator_delete(*(void **)child,0x20);
          }
        }
        else {
          *(Node **)(*(long *)(*(long *)child + 0x18) + 0x10) = local_48;
          if (local_48 != (Node *)0x0) {
            local_48->parent = *(Node **)(*(long *)child + 0x18);
          }
          setColor(this,&sibling,1);
          if (*(void **)child != (void *)0x0) {
            operator_delete(*(void **)child,0x20);
          }
        }
      }
      else {
        parent = (Node *)0x0;
        ptr = (Node *)0x0;
        local_38 = *(Node **)child;
        setColor(this,&local_38,2);
        while( true ) {
          while( true ) {
            while( true ) {
              bVar4 = false;
              if (local_38 != this->root) {
                iVar3 = getColor(this,&local_38);
                bVar4 = iVar3 == 2;
              }
              if (!bVar4) goto LAB_0010b814;
              ptr = local_38->parent;
              if (local_38 != ptr->left) break;
              parent = ptr->right;
              iVar3 = getColor(this,&parent);
              if (iVar3 == 0) {
                setColor(this,&parent,1);
                setColor(this,&ptr,0);
                leftRotate(this,&ptr);
              }
              else {
                iVar3 = getColor(this,&parent->left);
                if ((iVar3 != 1) || (iVar3 = getColor(this,&parent->right), iVar3 != 1)) {
                  iVar3 = getColor(this,&parent->right);
                  if (iVar3 == 1) {
                    setColor(this,&parent->left,1);
                    setColor(this,&parent,0);
                    rotateRight(this,&parent);
                    parent = ptr->right;
                  }
                  setColor(this,&parent,ptr->color);
                  setColor(this,&ptr,1);
                  setColor(this,&parent->right,1);
                  leftRotate(this,&ptr);
                  goto LAB_0010b814;
                }
                setColor(this,&parent,0);
                iVar3 = getColor(this,&ptr);
                if (iVar3 == 0) {
                  setColor(this,&ptr,1);
                }
                else {
                  setColor(this,&ptr,2);
                }
                local_38 = ptr;
              }
            }
            parent = ptr->left;
            iVar3 = getColor(this,&parent);
            if (iVar3 != 0) break;
            setColor(this,&parent,1);
            setColor(this,&ptr,0);
            rotateRight(this,&ptr);
          }
          iVar3 = getColor(this,&parent->left);
          if ((iVar3 != 1) || (iVar3 = getColor(this,&parent->right), iVar3 != 1)) break;
          setColor(this,&parent,0);
          iVar3 = getColor(this,&ptr);
          if (iVar3 == 0) {
            setColor(this,&ptr,1);
          }
          else {
            setColor(this,&ptr,2);
          }
          local_38 = ptr;
        }
        iVar3 = getColor(this,&parent->left);
        if (iVar3 == 1) {
          setColor(this,&parent->right,1);
          setColor(this,&parent,0);
          leftRotate(this,&parent);
          parent = ptr->left;
        }
        setColor(this,&parent,ptr->color);
        setColor(this,&ptr,1);
        setColor(this,&parent->left,1);
        rotateRight(this,&ptr);
LAB_0010b814:
        lVar2._0_4_ = child->value;
        lVar2._4_4_ = child->color;
        if (lVar2 == *(long *)(*(long *)(*(long *)child + 0x18) + 8)) {
          *(undefined8 *)(*(long *)(*(long *)child + 0x18) + 8) = 0;
        }
        else {
          *(undefined8 *)(*(long *)(*(long *)child + 0x18) + 0x10) = 0;
        }
        if (*(void **)child != (void *)0x0) {
          operator_delete(*(void **)child,0x20);
        }
        setColor(this,&this->root,1);
      }
    }
  }
  return;
}

Assistant:

void RedBlackTree::fixDelete(Node *&node) {
    if (node == nullptr) {
        return;
    }

    if (node == root) {
        root = nullptr;
        return;
    }
    if (getColor(node) == RED || getColor(node->left) == RED || getColor(node->right) == RED) {
        Node *child = node->left != nullptr ? node->left : node->right;

        if (node == node->parent->left) {
            node->parent->left = child;
            if (child != nullptr) {
                child->parent = node->parent;
            }
            setColor(child, BLACK);
            delete (node);
        } else {
            node->parent->right = child;
            if (child != nullptr) {
                child->parent = node->parent;
            }
            setColor(child, BLACK);
            delete (node);
        }
    } else {
        Node *sibling = nullptr;
        Node *parent = nullptr;
        Node *ptr = node;
        setColor(ptr, DOUBLE_BLACK);
        while (ptr != root && getColor(ptr) == DOUBLE_BLACK) {
            parent = ptr->parent;
            if (ptr == parent->left) {
                sibling = parent->right;
                if (getColor(sibling) == RED) {
                    setColor(sibling, BLACK);
                    setColor(parent, RED);
                    leftRotate(parent);
                } else {
                    if (getColor(sibling->left) == BLACK && getColor(sibling->right) == BLACK) {
                        setColor(sibling, RED);
                        if (getColor(parent) == RED) {
                            setColor(parent, BLACK);
                        } else {
                            setColor(parent, DOUBLE_BLACK);
                        }
                        ptr = parent;
                    } else {
                        if (getColor(sibling->right) == BLACK) {
                            setColor(sibling->left, BLACK);
                            setColor(sibling, RED);
                            rotateRight(sibling);
                            sibling = parent->right;
                        }
                        setColor(sibling, parent->color);
                        setColor(parent, BLACK);
                        setColor(sibling->right, BLACK);
                        leftRotate(parent);
                        break;
                    }
                }
            } else {
                sibling = parent->left;
                if (getColor(sibling) == RED) {
                    setColor(sibling, BLACK);
                    setColor(parent, RED);
                    rotateRight(parent);
                } else {
                    if (getColor(sibling->left) == BLACK && getColor(sibling->right) == BLACK) {
                        setColor(sibling, RED);
                        if (getColor(parent) == RED) {
                            setColor(parent, BLACK);
                        } else {
                            setColor(parent, DOUBLE_BLACK);
                        }
                        ptr = parent;
                    } else {
                        if (getColor(sibling->left) == BLACK) {
                            setColor(sibling->right, BLACK);
                            setColor(sibling, RED);
                            leftRotate(sibling);
                            sibling = parent->left;
                        }
                        setColor(sibling, parent->color);
                        setColor(parent, BLACK);
                        setColor(sibling->left, BLACK);
                        rotateRight(parent);
                        break;
                    }
                }
            }
        }
        if (node == node->parent->left) {
            node->parent->left = nullptr;
        } else {
            node->parent->right = nullptr;
        }
        delete (node);
        setColor(root, BLACK);
    }
}